

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CategoricalMapping::set_allocated_stringtoint64map
          (CategoricalMapping *this,StringToInt64Map *stringtoint64map)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  StringToInt64Map *stringtoint64map_local;
  CategoricalMapping *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_MappingType(this);
  if (stringtoint64map != (StringToInt64Map *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<google::protobuf::MessageLite>::GetOwningArena
                   (&stringtoint64map->super_MessageLite);
    message_arena = (Arena *)stringtoint64map;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::StringToInt64Map>
                              (message_arena_00,stringtoint64map,submessage_arena_00);
    }
    set_has_stringtoint64map(this);
    (this->MappingType_).stringtoint64map_ = (StringToInt64Map *)message_arena;
  }
  return;
}

Assistant:

void CategoricalMapping::set_allocated_stringtoint64map(::CoreML::Specification::StringToInt64Map* stringtoint64map) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_MappingType();
  if (stringtoint64map) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
        ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<
            ::PROTOBUF_NAMESPACE_ID::MessageLite>::GetOwningArena(
                reinterpret_cast<::PROTOBUF_NAMESPACE_ID::MessageLite*>(stringtoint64map));
    if (message_arena != submessage_arena) {
      stringtoint64map = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, stringtoint64map, submessage_arena);
    }
    set_has_stringtoint64map();
    MappingType_.stringtoint64map_ = stringtoint64map;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.CategoricalMapping.stringToInt64Map)
}